

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

int32_t uloc_acceptLanguage_63
                  (char *result,int32_t resultAvailable,UAcceptResult *outResult,char **acceptList,
                  int32_t acceptListCount,UEnumeration *availableLocales,UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  void *buffer;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  char tmp [158];
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    buffer = uprv_malloc_63((long)acceptListCount << 3);
    if (buffer == (void *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      uVar8 = 0;
      uVar7 = (ulong)(uint)acceptListCount;
      if (acceptListCount < 1) {
        uVar7 = uVar8;
      }
      iVar6 = 0;
      for (; iVar3 = iVar6, uVar8 != uVar7; uVar8 = uVar8 + 1) {
        while (iVar6 = iVar3, pcVar4 = uenum_next_63(availableLocales,(int32_t *)0x0,status),
              pcVar4 != (char *)0x0) {
          sVar5 = strlen(pcVar4);
          iVar1 = strcmp(acceptList[uVar8],pcVar4);
          iVar3 = (int)sVar5;
          if (iVar1 == 0) {
            if (outResult != (UAcceptResult *)0x0) {
              *outResult = ULOC_ACCEPT_VALID;
            }
            if (0 < iVar3) {
              iVar2 = uprv_min_63(iVar3,resultAvailable);
              strncpy(result,pcVar4,(long)iVar2);
            }
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              uprv_free_63(*(void **)((long)buffer + uVar7 * 8));
            }
            uprv_free_63(buffer);
LAB_002ca426:
            iVar2 = u_terminateChars_63(result,resultAvailable,iVar3,status);
            return iVar2;
          }
          if (iVar3 < iVar6) {
            iVar3 = iVar6;
          }
        }
        uenum_reset_63(availableLocales,status);
        iVar2 = uloc_getParent_63(acceptList[uVar8],tmp,0x9e,status);
        if (iVar2 == 0) {
          pcVar4 = (char *)0x0;
        }
        else {
          pcVar4 = uprv_strdup_63(tmp);
        }
        *(char **)((long)buffer + uVar8 * 8) = pcVar4;
      }
      while (1 < iVar6) {
        iVar6 = iVar6 + -1;
        for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
          pcVar4 = *(char **)((long)buffer + uVar8 * 8);
          if ((pcVar4 != (char *)0x0) && (sVar5 = strlen(pcVar4), iVar6 == (int)sVar5)) {
            while (pcVar4 = uenum_next_63(availableLocales,(int32_t *)0x0,status),
                  pcVar4 != (char *)0x0) {
              iVar3 = strcmp(*(char **)((long)buffer + uVar8 * 8),pcVar4);
              if (iVar3 == 0) {
                sVar5 = strlen(pcVar4);
                if (outResult != (UAcceptResult *)0x0) {
                  *outResult = ULOC_ACCEPT_FALLBACK;
                }
                iVar3 = (int)sVar5;
                if (0 < iVar3) {
                  iVar2 = uprv_min_63(iVar3,resultAvailable);
                  strncpy(result,pcVar4,(long)iVar2);
                }
                for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
                  uprv_free_63(*(void **)((long)buffer + uVar8 * 8));
                }
                uprv_free_63(buffer);
                goto LAB_002ca426;
              }
            }
            uenum_reset_63(availableLocales,status);
            iVar2 = uloc_getParent_63(*(char **)((long)buffer + uVar8 * 8),tmp,0x9e,status);
            uprv_free_63(*(void **)((long)buffer + uVar8 * 8));
            if (iVar2 == 0) {
              pcVar4 = (char *)0x0;
            }
            else {
              pcVar4 = uprv_strdup_63(tmp);
            }
            *(char **)((long)buffer + uVar8 * 8) = pcVar4;
          }
        }
        if (outResult != (UAcceptResult *)0x0) {
          *outResult = ULOC_ACCEPT_FAILED;
        }
      }
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        uprv_free_63(*(void **)((long)buffer + uVar8 * 8));
      }
      uprv_free_63(buffer);
    }
  }
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_acceptLanguage(char *result, int32_t resultAvailable,
                    UAcceptResult *outResult, const char **acceptList,
                    int32_t acceptListCount,
                    UEnumeration* availableLocales,
                    UErrorCode *status)
{
    int32_t i,j;
    int32_t len;
    int32_t maxLen=0;
    char tmp[ULOC_FULLNAME_CAPACITY+1];
    const char *l;
    char **fallbackList;
    if(U_FAILURE(*status)) {
        return -1;
    }
    fallbackList = static_cast<char **>(uprv_malloc((size_t)(sizeof(fallbackList[0])*acceptListCount)));
    if(fallbackList==NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return -1;
    }
    for(i=0;i<acceptListCount;i++) {
#if defined(ULOC_DEBUG)
        fprintf(stderr,"%02d: %s\n", i, acceptList[i]);
#endif
        while((l=uenum_next(availableLocales, NULL, status)) != NULL) {
#if defined(ULOC_DEBUG)
            fprintf(stderr,"  %s\n", l);
#endif
            len = (int32_t)uprv_strlen(l);
            if(!uprv_strcmp(acceptList[i], l)) {
                if(outResult) {
                    *outResult = ULOC_ACCEPT_VALID;
                }
#if defined(ULOC_DEBUG)
                fprintf(stderr, "MATCH! %s\n", l);
#endif
                if(len>0) {
                    uprv_strncpy(result, l, uprv_min(len, resultAvailable));
                }
                for(j=0;j<i;j++) {
                    uprv_free(fallbackList[j]);
                }
                uprv_free(fallbackList);
                return u_terminateChars(result, resultAvailable, len, status);
            }
            if(len>maxLen) {
                maxLen = len;
            }
        }
        uenum_reset(availableLocales, status);
        /* save off parent info */
        if(uloc_getParent(acceptList[i], tmp, UPRV_LENGTHOF(tmp), status)!=0) {
            fallbackList[i] = uprv_strdup(tmp);
        } else {
            fallbackList[i]=0;
        }
    }

    for(maxLen--;maxLen>0;maxLen--) {
        for(i=0;i<acceptListCount;i++) {
            if(fallbackList[i] && ((int32_t)uprv_strlen(fallbackList[i])==maxLen)) {
#if defined(ULOC_DEBUG)
                fprintf(stderr,"Try: [%s]", fallbackList[i]);
#endif
                while((l=uenum_next(availableLocales, NULL, status)) != NULL) {
#if defined(ULOC_DEBUG)
                    fprintf(stderr,"  %s\n", l);
#endif
                    len = (int32_t)uprv_strlen(l);
                    if(!uprv_strcmp(fallbackList[i], l)) {
                        if(outResult) {
                            *outResult = ULOC_ACCEPT_FALLBACK;
                        }
#if defined(ULOC_DEBUG)
                        fprintf(stderr, "fallback MATCH! %s\n", l);
#endif
                        if(len>0) {
                            uprv_strncpy(result, l, uprv_min(len, resultAvailable));
                        }
                        for(j=0;j<acceptListCount;j++) {
                            uprv_free(fallbackList[j]);
                        }
                        uprv_free(fallbackList);
                        return u_terminateChars(result, resultAvailable, len, status);
                    }
                }
                uenum_reset(availableLocales, status);

                if(uloc_getParent(fallbackList[i], tmp, UPRV_LENGTHOF(tmp), status)!=0) {
                    uprv_free(fallbackList[i]);
                    fallbackList[i] = uprv_strdup(tmp);
                } else {
                    uprv_free(fallbackList[i]);
                    fallbackList[i]=0;
                }
            }
        }
        if(outResult) {
            *outResult = ULOC_ACCEPT_FAILED;
        }
    }
    for(i=0;i<acceptListCount;i++) {
        uprv_free(fallbackList[i]);
    }
    uprv_free(fallbackList);
    return -1;
}